

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentDensity.cpp
# Opt level: O0

void __thiscall OpenMD::CurrentDensity::process(CurrentDensity *this)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  SnapshotManager *this_00;
  Snapshot *this_01;
  StuntDouble *pos_00;
  double *pdVar5;
  ulong uVar6;
  reference pvVar7;
  size_type sVar8;
  reference ppSVar9;
  reference pvVar10;
  long in_RDI;
  RealType RVar11;
  Vector3d vel;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  Atom *atom;
  RealType q;
  uint j;
  RealType binJc;
  uint i_1;
  Vector3d pos;
  int binNo;
  Mat3x3d hmat;
  RealType sliceVolume;
  RealType boxVolume;
  uint i;
  Vector3d COMvel;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int ii;
  StuntDouble *sd;
  Snapshot *in_stack_ffffffffffffeb98;
  DumpReader *in_stack_ffffffffffffeba0;
  StuntDouble *in_stack_ffffffffffffeba8;
  SelectionManager *in_stack_ffffffffffffebb0;
  undefined6 in_stack_ffffffffffffebd8;
  undefined1 in_stack_ffffffffffffebde;
  undefined1 in_stack_ffffffffffffebdf;
  Snapshot *in_stack_ffffffffffffec20;
  int in_stack_ffffffffffffec2c;
  DumpReader *in_stack_ffffffffffffec30;
  Vector<double,_3U> local_1390;
  FluctuatingChargeAdapter local_1378;
  FixedChargeAdapter local_1370;
  AtomType *local_1368;
  Atom *local_1360;
  SelectionManager *local_1358;
  uint local_134c;
  double local_1348;
  uint local_133c;
  Vector<double,_3U> local_1338;
  uint local_131c;
  RectMatrix<double,_3U,_3U> local_1300;
  double local_12b8;
  RealType local_12b0;
  uint local_12a4;
  Vector<double,_3U> local_12a0;
  int local_1288;
  int local_1274;
  string *in_stack_ffffffffffffedf0;
  SimInfo *in_stack_ffffffffffffedf8;
  DumpReader *in_stack_ffffffffffffee00;
  CurrentDensity *in_stack_ffffffffffffee70;
  StuntDouble *local_10;
  
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
  bVar3 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1fbe80);
  DumpReader::DumpReader
            (in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
  local_1274 = DumpReader::getNFrames(in_stack_ffffffffffffeba0);
  *(int *)(in_RDI + 0xd0) = local_1274 / *(int *)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 0x760) = 0;
  for (local_1288 = 0; local_1288 < local_1274; local_1288 = *(int *)(in_RDI + 0x30) + local_1288) {
    DumpReader::readFrame(in_stack_ffffffffffffec30,in_stack_ffffffffffffec2c);
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    this_01 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 200) = this_01;
    Thermo::getComVel((Thermo *)this_01);
    for (local_12a4 = 0; local_12a4 < *(uint *)(in_RDI + 0x34); local_12a4 = local_12a4 + 1) {
      std::
      vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
      ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                    *)(in_RDI + 0x718),(ulong)local_12a4);
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::clear
                ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x1fbfd6);
    }
    local_12b0 = Snapshot::getVolume((Snapshot *)in_stack_ffffffffffffeba0);
    local_12b8 = local_12b0 / (double)*(uint *)(in_RDI + 0x34);
    Snapshot::getHmat(in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffec30 = (DumpReader *)(in_RDI + 0x730);
    RectMatrix<double,_3U,_3U>::operator()
              (&local_1300,*(uint *)(in_RDI + 0x768),*(uint *)(in_RDI + 0x768));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffebb0,
               (value_type_conflict2 *)in_stack_ffffffffffffeba8);
    bVar4 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xf8));
    in_stack_ffffffffffffec2c = CONCAT13(bVar4,(int3)in_stack_ffffffffffffec2c);
    if (bVar4) {
      in_stack_ffffffffffffec20 = (Snapshot *)(in_RDI + 0x648);
      SelectionEvaluator::evaluate
                ((SelectionEvaluator *)
                 CONCAT17(in_stack_ffffffffffffebdf,
                          CONCAT16(in_stack_ffffffffffffebde,in_stack_ffffffffffffebd8)));
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffebb0,(SelectionSet *)in_stack_ffffffffffffeba8);
      SelectionSet::~SelectionSet((SelectionSet *)0x1fc13f);
    }
    pos_00 = SelectionManager::beginSelected
                       (in_stack_ffffffffffffebb0,(int *)in_stack_ffffffffffffeba8);
    local_10 = pos_00;
    while (local_10 != (StuntDouble *)0x0) {
      StuntDouble::getPos(in_stack_ffffffffffffeba8);
      if (bVar3) {
        Snapshot::wrapVector(in_stack_ffffffffffffec20,(Vector3d *)pos_00);
        uVar2 = *(uint *)(in_RDI + 0x34);
        pdVar5 = Vector<double,_3U>::operator[](&local_1338,*(uint *)(in_RDI + 0x768));
        dVar1 = *pdVar5;
        pdVar5 = RectMatrix<double,_3U,_3U>::operator()
                           (&local_1300,*(uint *)(in_RDI + 0x768),*(uint *)(in_RDI + 0x768));
        local_131c = (uint)(int)((double)uVar2 * (dVar1 / *pdVar5 + 0.5)) % *(uint *)(in_RDI + 0x34)
        ;
        std::
        vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
        ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                      *)(in_RDI + 0x718),(long)(int)local_131c);
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                  ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                   in_stack_ffffffffffffebb0,(value_type *)in_stack_ffffffffffffeba8);
      }
      local_10 = SelectionManager::nextSelected
                           (in_stack_ffffffffffffebb0,(int *)in_stack_ffffffffffffeba8);
    }
    for (local_133c = 0; local_133c < *(uint *)(in_RDI + 0x34); local_133c = local_133c + 1) {
      local_1348 = 0.0;
      local_134c = 0;
      while( true ) {
        uVar6 = (ulong)local_134c;
        pvVar7 = std::
                 vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               *)(in_RDI + 0x718),(ulong)local_133c);
        sVar8 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::size
                          (pvVar7);
        if (sVar8 <= uVar6) break;
        local_1358 = (SelectionManager *)0x0;
        pvVar7 = std::
                 vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               *)(in_RDI + 0x718),(ulong)local_133c);
        ppSVar9 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[](pvVar7,(ulong)local_134c);
        local_1360 = (Atom *)*ppSVar9;
        local_1368 = Atom::getAtomType(local_1360);
        pvVar7 = std::
                 vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               *)(in_RDI + 0x718),(ulong)local_133c);
        ppSVar9 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                  operator[](pvVar7,(ulong)local_134c);
        in_stack_ffffffffffffebdf = StuntDouble::isAtom(*ppSVar9);
        if ((bool)in_stack_ffffffffffffebdf) {
          FixedChargeAdapter::FixedChargeAdapter(&local_1370,local_1368);
          in_stack_ffffffffffffebde =
               FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x1fc45c);
          if ((bool)in_stack_ffffffffffffebde) {
            local_1358 = (SelectionManager *)
                         FixedChargeAdapter::getCharge
                                   ((FixedChargeAdapter *)in_stack_ffffffffffffeba0);
          }
          FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_1378,local_1368);
          bVar4 = FluctuatingChargeAdapter::isFluctuatingCharge
                            ((FluctuatingChargeAdapter *)0x1fc4b4);
          if (bVar4) {
            RVar11 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffeba0);
            local_1358 = (SelectionManager *)(RVar11 + (double)local_1358);
          }
          pvVar7 = std::
                   vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ::operator[]((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                                 *)(in_RDI + 0x718),(ulong)local_133c);
          std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator[]
                    (pvVar7,(ulong)local_134c);
          StuntDouble::getVel(in_stack_ffffffffffffeba8);
          in_stack_ffffffffffffebb0 = local_1358;
          pdVar5 = Vector<double,_3U>::operator[](&local_1390,*(uint *)(in_RDI + 0x768));
          in_stack_ffffffffffffeba0 = (DumpReader *)*pdVar5;
          in_stack_ffffffffffffeba8 =
               (StuntDouble *)Vector<double,_3U>::operator[](&local_12a0,*(uint *)(in_RDI + 0x768));
          local_1348 = (double)in_stack_ffffffffffffebb0 *
                       ((double)in_stack_ffffffffffffeba0 -
                       (double)(((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                  *)&in_stack_ffffffffffffeba8->_vptr_StuntDouble)->
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               )._M_impl.super__Vector_impl_data._M_start) + local_1348;
        }
        local_134c = local_134c + 1;
      }
      in_stack_ffffffffffffeb98 = (Snapshot *)(local_1348 / local_12b8);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748),
                           (ulong)local_133c);
      *pvVar10 = (double)in_stack_ffffffffffffeb98 + *pvVar10;
      *(double *)(in_RDI + 0x760) = local_1348 / local_12b0 + *(double *)(in_RDI + 0x760);
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1fc66b);
  }
  writeCurrentDensity(in_stack_ffffffffffffee70);
  DumpReader::~DumpReader(in_stack_ffffffffffffeba0);
  return;
}

Assistant:

void CurrentDensity::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames            = reader.getNFrames();
    nProcessed_            = nFrames / step_;
    overallCurrentDensity_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
      Vector3d COMvel  = thermo_.getComVel();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      RealType boxVolume   = currentSnapshot_->getVolume();
      RealType sliceVolume = boxVolume / nBins_;
      Mat3x3d hmat         = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        int binNo;
        Vector3d pos = sd->getPos();

        if (usePeriodicBoundaryConditions_) {
          currentSnapshot_->wrapVector(pos);
          binNo =
              int(nBins_ * (pos[axis_] / hmat(axis_, axis_) + 0.5)) % nBins_;
          sliceSDLists_[binNo].push_back(sd);
        }
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binJc = 0;

        for (unsigned int j = 0; j < sliceSDLists_[i].size(); ++j) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][j]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][j]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) q = fca.getCharge();

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) q += atom->getFlucQPos();

            Vector3d vel = sliceSDLists_[i][j]->getVel();
            binJc += q * (vel[axis_] - COMvel[axis_]);
          }
        }

        // Units of (e / Ang^2 / fs)
        currentDensity_[i] += binJc / sliceVolume;
        overallCurrentDensity_ += binJc / boxVolume;
      }
    }

    writeCurrentDensity();
  }